

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O2

SyncPointVkPtr __thiscall
Diligent::CommandQueueVkImpl::CreateSyncPoint(CommandQueueVkImpl *this,Uint64 dbgValue)

{
  SyncPointVk *this_00;
  Uint64 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SyncPointVkPtr SVar1;
  
  this_00 = (SyncPointVk *)
            FixedBlockMemoryAllocator::Allocate
                      ((FixedBlockMemoryAllocator *)(dbgValue + 0xa8),
                       (ulong)*(byte *)(dbgValue + 0x2b) * 0x20 + 0x38,"SyncPointVk",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
                       ,0x8c);
  SyncPointVk::SyncPointVk
            (this_00,(SoftwareQueueIndex)*(uchar *)(dbgValue + 0x29),
             (uint)*(byte *)(dbgValue + 0x2b),*(VulkanSyncObjectManager **)(dbgValue + 0x98),
             *(VkDevice *)(*(long *)(dbgValue + 0x10) + 0x10),in_RDX);
  std::__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Diligent::SyncPointVk,Diligent::CommandQueueVkImpl::CreateSyncPoint(unsigned_long)::_lambda(Diligent::SyncPointVk*)_1_,void>
            ((__shared_ptr<Diligent::SyncPointVk,(__gnu_cxx::_Lock_policy)2> *)this,this_00,
             (FixedBlockMemoryAllocator *)(dbgValue + 0xa8));
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SyncPointVkPtr)SVar1.super___shared_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

__forceinline SyncPointVkPtr CommandQueueVkImpl::CreateSyncPoint(Uint64 dbgValue)
{
    auto* pAllocator = &m_SyncPointAllocator;
    void* ptr        = pAllocator->Allocate(SyncPointVk::SizeOf(m_NumCommandQueues), "SyncPointVk", __FILE__, __LINE__);
    auto  Deleter    = [pAllocator](SyncPointVk* ptr) //
    {
        ptr->~SyncPointVk();
        pAllocator->Free(ptr);
    };

    return {new (ptr) SyncPointVk{m_CommandQueueId, m_NumCommandQueues, *m_SyncObjectManager, m_LogicalDevice->GetVkDevice(), dbgValue}, std::move(Deleter)};
}